

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t dim)

{
  TPZVec<std::complex<double>_> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<std::complex<double>_*> *unaff_retaddr;
  int64_t in_stack_ffffffffffffffa8;
  TPZVec<std::complex<double>_*> *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffffd0;
  int64_t size;
  TPZRegisterClassId *copy;
  
  size = 0;
  copy = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZSkylMatrix<std::complex<double>>>(in_RDI,0x21);
  TPZMatrix<std::complex<double>_>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (int64_t)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZSkylMatrix_02414850;
  TPZVec<std::complex<double>_*>::TPZVec(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZVec<std::complex<double>_>::TPZVec(in_RSI,size);
  TPZVec<std::complex<double>_*>::Fill(unaff_retaddr,(complex<double> **)copy,(int64_t)in_RSI,size);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
}